

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

void Abc_ConvertAigToBdd_rec1(DdManager *dd,Hop_Obj_t *pObj)

{
  Hop_Obj_t *f;
  Hop_Obj_t *g;
  DdNode *n;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcFunc.c"
                  ,0x2d5,"void Abc_ConvertAigToBdd_rec1(DdManager *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Abc_ConvertAigToBdd_rec1(dd,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Abc_ConvertAigToBdd_rec1(dd,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    f = Hop_ObjChild0Copy(pObj);
    g = Hop_ObjChild1Copy(pObj);
    n = Cudd_bddAnd(dd,(DdNode *)f,(DdNode *)g);
    (pObj->field_0).pData = n;
    Cudd_Ref(n);
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcFunc.c"
                    ,0x2dc,"void Abc_ConvertAigToBdd_rec1(DdManager *, Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  return;
}

Assistant:

void Abc_ConvertAigToBdd_rec1( DdManager * dd, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToBdd_rec1( dd, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToBdd_rec1( dd, Hop_ObjFanin1(pObj) );
    pObj->pData = Cudd_bddAnd( dd, (DdNode *)Hop_ObjChild0Copy(pObj), (DdNode *)Hop_ObjChild1Copy(pObj) ); 
    Cudd_Ref( (DdNode *)pObj->pData );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}